

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcStdin.c
# Opt level: O0

void Wlc_NtkReport(Wlc_Ntk_t *p,Abc_Cex_t *pCex,char *pName,int Radix)

{
  int iVar1;
  int iVar2;
  Vec_Str_t *p_00;
  char *pcVar3;
  char *local_60;
  int local_44;
  int local_40;
  int nBits;
  int Start;
  int Name;
  int NameId;
  int i;
  Vec_Str_t *vNum;
  int Radix_local;
  char *pName_local;
  Abc_Cex_t *pCex_local;
  Wlc_Ntk_t *p_local;
  
  local_40 = -1;
  local_44 = -1;
  if (pCex->nRegs != 0) {
    __assert_fail("pCex->nRegs == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlcStdin.c"
                  ,0x72,"void Wlc_NtkReport(Wlc_Ntk_t *, Abc_Cex_t *, char *, int)");
  }
  iVar1 = Abc_NamStrFind(p->pManName,pName);
  if (iVar1 < 1) {
    printf("Cannot find \"%s\" among nodes of the network.\n",pName);
  }
  else {
    for (Name = 0; iVar2 = Vec_IntSize(&p->vValues), Name + 2 < iVar2; Name = Name + 3) {
      iVar2 = Vec_IntEntry(&p->vValues,Name);
      local_40 = Vec_IntEntry(&p->vValues,Name + 1);
      local_44 = Vec_IntEntry(&p->vValues,Name + 2);
      if (iVar2 == iVar1) break;
    }
    iVar1 = Vec_IntSize(&p->vValues);
    if (Name == iVar1) {
      printf("Cannot find \"%s\" among primary inputs of the network.\n",pName);
    }
    else {
      if (((Radix != 2) && (Radix != 10)) && (Radix != 0x10)) {
        __assert_fail("Radix == 2 || Radix == 10 || Radix == 16",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlcStdin.c"
                      ,0x85,"void Wlc_NtkReport(Wlc_Ntk_t *, Abc_Cex_t *, char *, int)");
      }
      p_00 = Wlc_ConvertToRadix((uint *)(pCex + 1),local_40,local_44,Radix);
      if (Radix == 0x10) {
        local_60 = "#x";
      }
      else {
        local_60 = "";
        if (Radix == 2) {
          local_60 = "#b";
        }
      }
      pcVar3 = Vec_StrArray(p_00);
      printf("((%s %s%s))\n",pName,local_60,pcVar3);
      Vec_StrFree(p_00);
    }
  }
  return;
}

Assistant:

void Wlc_NtkReport( Wlc_Ntk_t * p, Abc_Cex_t * pCex, char * pName, int Radix )
{
    Vec_Str_t * vNum;
    int i, NameId, Name, Start = -1, nBits = -1;
    assert( pCex->nRegs == 0 );
    // get the name ID
    NameId = Abc_NamStrFind( p->pManName, pName );
    if ( NameId <= 0 )
    {
        printf( "Cannot find \"%s\" among nodes of the network.\n", pName );
        return;
    }
    // get the primary input
    Vec_IntForEachEntryTriple( &p->vValues, Name, Start, nBits, i )
        if ( Name == NameId )
            break;
    // find the PI
    if ( i == Vec_IntSize(&p->vValues) )
    {
        printf( "Cannot find \"%s\" among primary inputs of the network.\n", pName );
        return;
    }
    // print value
    assert( Radix == 2 || Radix == 10 || Radix == 16 );
    vNum = Wlc_ConvertToRadix( pCex->pData, Start, nBits, Radix );
    printf( "((%s %s%s))\n", pName, Radix == 16 ? "#x" : (Radix == 2 ? "#b" : ""), Vec_StrArray(vNum) );
    Vec_StrFree( vNum );
}